

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

uchar __thiscall ieee754::mantissa_msb_mask(ieee754 *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = this->ebits;
  if ((int)uVar2 < 8) {
    uVar1 = 0x7f;
  }
  else {
    if (0xf < uVar2) {
      return '\0';
    }
    uVar2 = (uint)(byte)((char)uVar2 - 7);
    uVar1 = 0xff;
  }
  return (uchar)(uVar1 >> ((byte)uVar2 & 0x1f));
}

Assistant:

unsigned char mantissa_msb_mask() const
    {
        if (ebits <= 7)
            return (0x7f >> ebits);
        else if (ebits <= 15)
            return (0xff >> (ebits - 7));
        else
        {
            assert(FALSE);
            return 0;
        }
    }